

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_status(int stat)

{
  int iVar1;
  int in_EDI;
  uint unaff_retaddr;
  void *in_stack_00000008;
  osgen_win_t *in_stack_00000010;
  int in_stack_0000001c;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  int in_stack_00000030;
  
  if (os_f_plain == 0) {
    if ((S_status_win == (osgen_txtwin_t *)0x0) &&
       (S_status_win = osgen_create_txtwin(in_stack_0000001c,in_stack_00000010,in_stack_00000008,
                                           stat,unaff_retaddr),
       S_status_win != (osgen_txtwin_t *)0x0)) {
      (S_status_win->base).alignment = 0;
      (S_status_win->base).size = 1;
      (S_status_win->base).size_type = 2;
      (S_status_win->base).txtfg = '\x04';
      (S_status_win->base).txtbg = '\x01';
      (S_status_win->base).fillcolor = '\x05';
      iVar1 = ossgetcolor(in_stack_00000030,in_stack_0000002c,in_stack_00000028,in_stack_00000024);
      (S_status_win->base).oss_fillcolor = iVar1;
      osgen_recalc_layout();
    }
    if (((in_EDI == 1) && (status_mode != 1)) && (S_status_win != (osgen_txtwin_t *)0x0)) {
      S_default_win = S_status_win;
      osgen_clear_win(in_stack_00000010);
      S_stat_reset_free = (char *)0x0;
    }
    if (((status_mode == 1) && (in_EDI != 1)) && (S_status_win != (osgen_txtwin_t *)0x0)) {
      S_stat_reset_free = S_status_win->txtfree;
      S_stat_reset_x = (S_status_win->base).x;
      osgen_update_stat_right();
    }
    status_mode = in_EDI;
    if (in_EDI == 0) {
      S_default_win = S_main_win;
    }
    else if (in_EDI == 2) {
      S_default_win = (osgen_txtwin_t *)0x0;
    }
  }
  else if (in_EDI == 0) {
    status_mode = 0;
  }
  else if (in_EDI == 1) {
    status_mode = 2;
  }
  else if (in_EDI == 2) {
    status_mode = 2;
  }
  return;
}

Assistant:

void os_status(int stat)
{
    /* if we're in 'plain' mode, suppress all statusline output */
    if (os_f_plain)
    {
        /* check the requested mode */
        switch(stat)
        {
        case 0:
            /* switching to main text mode */
            status_mode = 0;
            break;

        case 1:
            /* switching to statusline mode - suppress all output */
            status_mode = 2;
            break;

        case 2:
            /* suppress mode */
            status_mode = 2;
            break;
        }

        /* done */
        return;
    }

    /* if there's no statusline window, create one */
    if (S_status_win == 0)
    {
        /* create the statusline window as a child of the main window */
        S_status_win = osgen_create_txtwin(OS_BANNER_FIRST, 0, S_main_win,
                                           512, 1);

        /* if that succeeded, set up the window */
        if (S_status_win != 0)
        {
            /* set up the statusline window at the top of the screen */
            S_status_win->base.alignment = OS_BANNER_ALIGN_TOP;
            S_status_win->base.size = 1;
            S_status_win->base.size_type = OS_BANNER_SIZE_ABS;

            /* use the default statusline color in this window */
            S_status_win->base.txtfg = OSGEN_COLOR_STATUSLINE;
            S_status_win->base.txtbg = OSGEN_COLOR_TRANSPARENT;
            S_status_win->base.fillcolor = OSGEN_COLOR_STATUSBG;

            /* cache the oss translations of the colors */
            S_status_win->base.oss_fillcolor =
                ossgetcolor(OSGEN_COLOR_STATUSLINE, OSGEN_COLOR_STATUSBG,
                            0, 0);

            /* recalculate the window layout */
            osgen_recalc_layout();
        }
    }

    /* if entering status mode 1, clear the statusline */
    if (stat == 1 && status_mode != 1 && S_status_win != 0)
    {
        /* switch the default window to the status line */
        S_default_win = S_status_win;

        /* clear the statusline window */
        osgen_clear_win(&S_status_win->base);

        /* forget the score reset point */
        S_stat_reset_free = 0;
    }

    /* if we're leaving status mode 1, finish the statusline */
    if (status_mode == 1 && stat != 1 && S_status_win != 0)
    {
        /* 
         *   remember the current statusline window settings as the "reset"
         *   point - this is where we reset the buffer contents whenever we
         *   want to add the right-half string 
         */
        S_stat_reset_free = S_status_win->txtfree;
        S_stat_reset_x = S_status_win->base.x;

        /* update the right-half string */
        osgen_update_stat_right();
    }

    /* switch to the new mode */
    status_mode = stat;

    /* check the mode */
    if (status_mode == 0)
    {
        /* switching to the main window */
        S_default_win = S_main_win;
    }
    else if (status_mode == 2)
    {
        /* 
         *   entering post-status mode - ignore everything, so set the
         *   default window to null 
         */
        S_default_win = 0;
    }
}